

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::ExpandTestsToRunInformation(cmCTestTestHandler *this,size_t numTests)

{
  int iVar1;
  ulong uVar2;
  iterator iVar3;
  iterator iVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  const_iterator local_88;
  const_iterator local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> new_end;
  int local_44;
  int local_40;
  int local_3c;
  int i;
  int val;
  size_type pos2;
  size_type pos;
  double stride;
  int end;
  int start;
  size_t numTests_local;
  cmCTestTestHandler *this_local;
  
  _end = numTests;
  numTests_local = (size_t)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    stride._0_4_ = -1;
    pos = 0xbff0000000000000;
    pos2 = 0;
    iVar1 = anon_unknown.dwarf_6ad80::GetNextNumber
                      (&this->TestsToRunString,(int *)((long)&stride + 4),&pos2,(size_type *)&i);
    if (((iVar1 != 0) &&
        (iVar1 = anon_unknown.dwarf_6ad80::GetNextNumber
                           (&this->TestsToRunString,(int *)&stride,&pos2,(size_type *)&i),
        iVar1 != 0)) &&
       (iVar1 = anon_unknown.dwarf_6ad80::GetNextRealNumber
                          (&this->TestsToRunString,(double *)&pos,&pos2,(size_type *)&i), iVar1 != 0
       )) {
      local_3c = 0;
      while (iVar1 = anon_unknown.dwarf_6ad80::GetNextNumber
                               (&this->TestsToRunString,&local_3c,&pos2,(size_type *)&i), iVar1 != 0
            ) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->TestsToRun,&local_3c);
      }
      std::vector<int,_std::allocator<int>_>::push_back(&this->TestsToRun,&local_3c);
    }
    if (stride._4_4_ == -1) {
      stride._4_4_ = 1;
    }
    if (stride._0_4_ == -1) {
      stride._0_4_ = (int)_end;
    }
    if (((double)pos == -1.0) && (!NAN((double)pos))) {
      pos = 0x3ff0000000000000;
    }
    if (((stride._0_4_ != -1) && (stride._4_4_ != -1)) && (0.0 < (double)pos)) {
      for (local_40 = 0;
          (double)local_40 * (double)pos + (double)stride._4_4_ <= (double)stride._0_4_;
          local_40 = local_40 + 1) {
        local_44 = (int)((double)local_40 * (double)pos + (double)stride._4_4_);
        std::vector<int,_std::allocator<int>_>::push_back(&this->TestsToRun,&local_44);
      }
    }
    iVar3 = std::vector<int,_std::allocator<int>_>::begin(&this->TestsToRun);
    iVar4 = std::vector<int,_std::allocator<int>_>::end(&this->TestsToRun);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
              (iVar3._M_current,iVar4._M_current);
    local_70._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->TestsToRun);
    local_78 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->TestsToRun);
    local_68 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (local_70,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_78);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_80,
               &local_68);
    local_90._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->TestsToRun);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_88,
               &local_90);
    std::vector<int,_std::allocator<int>_>::erase(&this->TestsToRun,local_80,local_88);
  }
  return;
}

Assistant:

void cmCTestTestHandler::ExpandTestsToRunInformation(size_t numTests)
{
  if (this->TestsToRunString.empty()) {
    return;
  }

  int start;
  int end = -1;
  double stride = -1;
  std::string::size_type pos = 0;
  std::string::size_type pos2;
  // read start
  if (GetNextNumber(this->TestsToRunString, start, pos, pos2)) {
    // read end
    if (GetNextNumber(this->TestsToRunString, end, pos, pos2)) {
      // read stride
      if (GetNextRealNumber(this->TestsToRunString, stride, pos, pos2)) {
        int val = 0;
        // now read specific numbers
        while (GetNextNumber(this->TestsToRunString, val, pos, pos2)) {
          this->TestsToRun.push_back(val);
        }
        this->TestsToRun.push_back(val);
      }
    }
  }

  // if start is not specified then we assume we start at 1
  if (start == -1) {
    start = 1;
  }

  // if end isnot specified then we assume we end with the last test
  if (end == -1) {
    end = static_cast<int>(numTests);
  }

  // if the stride wasn't specified then it defaults to 1
  if (stride == -1) {
    stride = 1;
  }

  // if we have a range then add it
  if (end != -1 && start != -1 && stride > 0) {
    int i = 0;
    while (i * stride + start <= end) {
      this->TestsToRun.push_back(static_cast<int>(i * stride + start));
      ++i;
    }
  }

  // sort the array
  std::sort(this->TestsToRun.begin(), this->TestsToRun.end(),
            std::less<int>());
  // remove duplicates
  auto new_end = std::unique(this->TestsToRun.begin(), this->TestsToRun.end());
  this->TestsToRun.erase(new_end, this->TestsToRun.end());
}